

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensureComboBox(QInputDialogPrivate *this)

{
  long lVar1;
  QComboBox *pQVar2;
  QWidgetPrivate *pQVar3;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  offset_in_QComboBox_to_subr unaff_retaddr;
  QInputDialog *q;
  QWidget *in_stack_ffffffffffffff88;
  code *receiverPrivate;
  QInputDialogPrivate *pQVar4;
  ConnectionType type;
  Object *in_stack_ffffffffffffffc8;
  Object *in_stack_ffffffffffffffd0;
  Connection local_28;
  code *local_20;
  undefined8 uStack_18;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  q_func(in_RDI);
  type = (ConnectionType)((ulong)pQVar4 >> 0x20);
  if (in_RDI->comboBox == (QComboBox *)0x0) {
    pQVar2 = (QComboBox *)operator_new(0x28);
    QComboBox::QComboBox((QComboBox *)in_RDI,in_stack_ffffffffffffff88);
    in_RDI->comboBox = pQVar2;
    pQVar3 = qt_widget_private((QWidget *)0x79afc4);
    pQVar3->field_0x253 = pQVar3->field_0x253 | 4;
    QWidget::hide((QWidget *)0x79afe7);
    receiverPrivate = textChanged;
    local_20 = textChanged;
    uStack_18 = 0;
    QObjectPrivate::
    connect<void(QComboBox::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              (in_stack_ffffffffffffffd0,unaff_retaddr,in_stack_ffffffffffffffc8,
               (Function)in_stack_fffffffffffffff0.d_ptr,type);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
    QObjectPrivate::
    connect<void(QComboBox::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              ((Object *)0x0,unaff_retaddr,(Object *)receiverPrivate,
               (Function)in_stack_fffffffffffffff0.d_ptr,type);
    QMetaObject::Connection::~Connection(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureComboBox()
{
    Q_Q(QInputDialog);
    if (!comboBox) {
        comboBox = new QComboBox(q);
#ifndef QT_NO_IM
        qt_widget_private(comboBox)->inheritsInputMethodHints = 1;
#endif
        comboBox->hide();
        QObjectPrivate::connect(comboBox, &QComboBox::editTextChanged,
                                this, &QInputDialogPrivate::textChanged);
        QObjectPrivate::connect(comboBox, &QComboBox::currentTextChanged,
                                this, &QInputDialogPrivate::textChanged);
    }
}